

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O0

Shader LoadShader(char *vsFileName,char *fsFileName)

{
  int iVar1;
  Shader SVar2;
  char *local_40;
  char *fShaderStr;
  char *vShaderStr;
  int i;
  char *fsFileName_local;
  char *vsFileName_local;
  Shader shader;
  
  memset(&vsFileName_local,0,0x10);
  shader._0_8_ = calloc(0x20,4);
  for (vShaderStr._4_4_ = 0; vShaderStr._4_4_ < 0x20; vShaderStr._4_4_ = vShaderStr._4_4_ + 1) {
    *(undefined4 *)(shader._0_8_ + (long)vShaderStr._4_4_ * 4) = 0xffffffff;
  }
  fShaderStr = (char *)0x0;
  local_40 = (char *)0x0;
  if (vsFileName != (char *)0x0) {
    fShaderStr = LoadFileText(vsFileName);
  }
  if (fsFileName != (char *)0x0) {
    local_40 = LoadFileText(fsFileName);
  }
  vsFileName_local._0_4_ = rlLoadShaderCode(fShaderStr,local_40);
  if (fShaderStr != (char *)0x0) {
    free(fShaderStr);
  }
  if (local_40 != (char *)0x0) {
    free(local_40);
  }
  if ((uint)vsFileName_local != 0) {
    iVar1 = rlGetLocationAttrib((uint)vsFileName_local,"vertexPosition");
    *(int *)shader._0_8_ = iVar1;
    iVar1 = rlGetLocationAttrib((uint)vsFileName_local,"vertexTexCoord");
    *(int *)(shader._0_8_ + 4) = iVar1;
    iVar1 = rlGetLocationAttrib((uint)vsFileName_local,"vertexTexCoord2");
    *(int *)(shader._0_8_ + 8) = iVar1;
    iVar1 = rlGetLocationAttrib((uint)vsFileName_local,"vertexNormal");
    *(int *)(shader._0_8_ + 0xc) = iVar1;
    iVar1 = rlGetLocationAttrib((uint)vsFileName_local,"vertexTangent");
    *(int *)(shader._0_8_ + 0x10) = iVar1;
    iVar1 = rlGetLocationAttrib((uint)vsFileName_local,"vertexColor");
    *(int *)(shader._0_8_ + 0x14) = iVar1;
    iVar1 = rlGetLocationUniform((uint)vsFileName_local,"mvp");
    *(int *)(shader._0_8_ + 0x18) = iVar1;
    iVar1 = rlGetLocationUniform((uint)vsFileName_local,"view");
    *(int *)(shader._0_8_ + 0x1c) = iVar1;
    iVar1 = rlGetLocationUniform((uint)vsFileName_local,"projection");
    *(int *)(shader._0_8_ + 0x20) = iVar1;
    iVar1 = rlGetLocationUniform((uint)vsFileName_local,"matNormal");
    *(int *)(shader._0_8_ + 0x28) = iVar1;
    iVar1 = rlGetLocationUniform((uint)vsFileName_local,"colDiffuse");
    *(int *)(shader._0_8_ + 0x30) = iVar1;
    iVar1 = rlGetLocationUniform((uint)vsFileName_local,"texture0");
    *(int *)(shader._0_8_ + 0x3c) = iVar1;
    iVar1 = rlGetLocationUniform((uint)vsFileName_local,"texture1");
    *(int *)(shader._0_8_ + 0x40) = iVar1;
    iVar1 = rlGetLocationUniform((uint)vsFileName_local,"texture2");
    *(int *)(shader._0_8_ + 0x44) = iVar1;
  }
  SVar2._4_4_ = 0;
  SVar2.id = (uint)vsFileName_local;
  SVar2.locs = (int *)shader._0_8_;
  return SVar2;
}

Assistant:

Shader LoadShader(const char *vsFileName, const char *fsFileName)
{
    Shader shader = { 0 };
    shader.locs = (int *)RL_CALLOC(MAX_SHADER_LOCATIONS, sizeof(int));

    // NOTE: All locations must be reseted to -1 (no location)
    for (int i = 0; i < MAX_SHADER_LOCATIONS; i++) shader.locs[i] = -1;

    char *vShaderStr = NULL;
    char *fShaderStr = NULL;

    if (vsFileName != NULL) vShaderStr = LoadFileText(vsFileName);
    if (fsFileName != NULL) fShaderStr = LoadFileText(fsFileName);

    shader.id = rlLoadShaderCode(vShaderStr, fShaderStr);

    if (vShaderStr != NULL) RL_FREE(vShaderStr);
    if (fShaderStr != NULL) RL_FREE(fShaderStr);

    // After shader loading, we TRY to set default location names
    if (shader.id > 0)
    {
        // Default shader attrib locations have been fixed before linking:
        //          vertex position location    = 0
        //          vertex texcoord location    = 1
        //          vertex normal location      = 2
        //          vertex color location       = 3
        //          vertex tangent location     = 4
        //          vertex texcoord2 location   = 5

        // NOTE: If any location is not found, loc point becomes -1

        // Get handles to GLSL input attibute locations
        shader.locs[SHADER_LOC_VERTEX_POSITION] = rlGetLocationAttrib(shader.id, DEFAULT_SHADER_ATTRIB_NAME_POSITION);
        shader.locs[SHADER_LOC_VERTEX_TEXCOORD01] = rlGetLocationAttrib(shader.id, DEFAULT_SHADER_ATTRIB_NAME_TEXCOORD);
        shader.locs[SHADER_LOC_VERTEX_TEXCOORD02] = rlGetLocationAttrib(shader.id, DEFAULT_SHADER_ATTRIB_NAME_TEXCOORD2);
        shader.locs[SHADER_LOC_VERTEX_NORMAL] = rlGetLocationAttrib(shader.id, DEFAULT_SHADER_ATTRIB_NAME_NORMAL);
        shader.locs[SHADER_LOC_VERTEX_TANGENT] = rlGetLocationAttrib(shader.id, DEFAULT_SHADER_ATTRIB_NAME_TANGENT);
        shader.locs[SHADER_LOC_VERTEX_COLOR] = rlGetLocationAttrib(shader.id, DEFAULT_SHADER_ATTRIB_NAME_COLOR);

        // Get handles to GLSL uniform locations (vertex shader)
        shader.locs[SHADER_LOC_MATRIX_MVP] = rlGetLocationUniform(shader.id, "mvp");
        shader.locs[SHADER_LOC_MATRIX_VIEW] = rlGetLocationUniform(shader.id, "view");
        shader.locs[SHADER_LOC_MATRIX_PROJECTION] = rlGetLocationUniform(shader.id, "projection");
        shader.locs[SHADER_LOC_MATRIX_NORMAL] = rlGetLocationUniform(shader.id, "matNormal");

        // Get handles to GLSL uniform locations (fragment shader)
        shader.locs[SHADER_LOC_COLOR_DIFFUSE] = rlGetLocationUniform(shader.id, "colDiffuse");
        shader.locs[SHADER_LOC_MAP_DIFFUSE] = rlGetLocationUniform(shader.id, "texture0");
        shader.locs[SHADER_LOC_MAP_SPECULAR] = rlGetLocationUniform(shader.id, "texture1");
        shader.locs[SHADER_LOC_MAP_NORMAL] = rlGetLocationUniform(shader.id, "texture2");
    }

    return shader;
}